

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JobResults.cpp
# Opt level: O2

void __thiscall
xmrig::JobBaton::JobBaton
          (JobBaton *this,list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_> *bundles,
          IJobResultListener *listener,bool hwAES)

{
  (this->super_Baton<uv_work_s>).req.data = this;
  this->hwAES = hwAES;
  this->listener = listener;
  std::__detail::_List_node_header::_List_node_header
            ((_List_node_header *)&this->bundles,(_List_node_header *)bundles);
  *(undefined8 *)
   ((long)&(this->results).super__Vector_base<xmrig::JobResult,_std::allocator<xmrig::JobResult>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->results).super__Vector_base<xmrig::JobResult,_std::allocator<xmrig::JobResult>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->results).super__Vector_base<xmrig::JobResult,_std::allocator<xmrig::JobResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->results).super__Vector_base<xmrig::JobResult,_std::allocator<xmrig::JobResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

inline JobBaton(std::list<JobBundle> &&bundles, IJobResultListener *listener, bool hwAES) :
        hwAES(hwAES),
        listener(listener),
        bundles(std::move(bundles))
    {}